

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

char * kwsysSystem_Shell__SkipMakeVariables(char *c)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  
  while( true ) {
    pcVar3 = c;
    if (*pcVar3 != '$') {
      return pcVar3;
    }
    if (pcVar3[1] != '(') break;
    c = pcVar3 + 3;
    while ((cVar1 = c[-1], cVar1 == '_' ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 4) != 0))
           ))) {
      c = c + 1;
    }
    if (cVar1 != ')') {
      return pcVar3;
    }
  }
  return pcVar3;
}

Assistant:

static const char* kwsysSystem_Shell__SkipMakeVariables(const char* c)
{
  while(*c == '$' && *(c+1) == '(')
    {
    const char* skip = c+2;
    while(kwsysSystem_Shell__CharIsMakeVariableName(*skip))
      {
      ++skip;
      }
    if(*skip == ')')
      {
      c = skip+1;
      }
    else
      {
      break;
      }
    }
  return c;
}